

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.h
# Opt level: O0

void helper::replace<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchIn,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchFor,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *replaceWith)

{
  string *psVar1;
  long lVar2;
  undefined8 local_28;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *replaceWith_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchFor_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchIn_local;
  
  local_28 = 0;
  while (local_28 != 0xffffffffffffffff) {
    local_28 = std::__cxx11::string::find((string *)searchIn,(ulong)searchFor);
    if (local_28 != 0xffffffffffffffff) {
      psVar1 = (string *)std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)searchIn,local_28,psVar1);
      lVar2 = std::__cxx11::string::size();
      local_28 = lVar2 + local_28;
    }
  }
  return;
}

Assistant:

void replace( T &searchIn, const T &searchFor, const T &replaceWith )
	{
		size_t pos = 0;
		while( pos != T::npos )
		{
			pos = searchIn.find( searchFor, pos );
			if( pos != T::npos )
			{
				searchIn.replace( pos, searchFor.size(), replaceWith );
				pos += replaceWith.size();
			}
		}
	}